

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNodePtr xmlNewNodeEatName(xmlNsPtr ns,xmlChar *name)

{
  xmlRegisterNodeFunc *pp_Var1;
  xmlNodePtr cur;
  xmlChar *name_local;
  xmlNsPtr ns_local;
  
  if (name == (xmlChar *)0x0) {
    ns_local = (xmlNsPtr)0x0;
  }
  else {
    ns_local = (xmlNsPtr)(*xmlMalloc)(0x78);
    if ((xmlNodePtr)ns_local == (xmlNodePtr)0x0) {
      xmlTreeErrMemory("building node");
      ns_local = (xmlNsPtr)0x0;
    }
    else {
      memset(ns_local,0,0x78);
      ((xmlNodePtr)ns_local)->type = XML_ELEMENT_NODE;
      ((xmlNodePtr)ns_local)->name = name;
      ((xmlNodePtr)ns_local)->ns = ns;
      if ((__xmlRegisterCallbacks != 0) &&
         (pp_Var1 = __xmlRegisterNodeDefaultValue(), *pp_Var1 != (xmlRegisterNodeFunc)0x0)) {
        pp_Var1 = __xmlRegisterNodeDefaultValue();
        (**pp_Var1)((xmlNodePtr)ns_local);
      }
    }
  }
  return (xmlNodePtr)ns_local;
}

Assistant:

xmlNodePtr
xmlNewNodeEatName(xmlNsPtr ns, xmlChar *name) {
    xmlNodePtr cur;

    if (name == NULL) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlNewNode : name == NULL\n");
#endif
	return(NULL);
    }

    /*
     * Allocate a new node and fill the fields.
     */
    cur = (xmlNodePtr) xmlMalloc(sizeof(xmlNode));
    if (cur == NULL) {
	xmlTreeErrMemory("building node");
	/* we can't check here that name comes from the doc dictionary */
	return(NULL);
    }
    memset(cur, 0, sizeof(xmlNode));
    cur->type = XML_ELEMENT_NODE;

    cur->name = name;
    cur->ns = ns;

    if ((__xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	xmlRegisterNodeDefaultValue((xmlNodePtr)cur);
    return(cur);
}